

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ErrorWithMsg(sqlite3 *db,int err_code,char *zFormat,...)

{
  char in_AL;
  sqlite3_value *psVar1;
  char *pcVar2;
  undefined8 in_RCX;
  _func_void_void_ptr *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_e8 [24];
  undefined8 local_d0;
  _func_void_void_ptr *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  __va_list_tag local_38;
  long local_20;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  db->errCode = err_code;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sqlite3SystemError(db,err_code);
  if (zFormat == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sqlite3Error(db,err_code);
      return;
    }
    goto LAB_00121a75;
  }
  if (db->pErr == (sqlite3_value *)0x0) {
    psVar1 = sqlite3ValueNew(db);
    db->pErr = psVar1;
    if (psVar1 != (sqlite3_value *)0x0) goto LAB_001219db;
  }
  else {
LAB_001219db:
    local_38.gp_offset = 0x18;
    local_38.fp_offset = 0x30;
    local_38.overflow_arg_area = &stack0x00000008;
    local_38.reg_save_area = auStack_e8;
    pcVar2 = sqlite3VMPrintf(db,zFormat,&local_38);
    sqlite3ValueSetStr(db->pErr,(int)pcVar2,(void *)0x1,0xf3,in_R8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00121a75:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ErrorWithMsg(sqlite3 *db, int err_code, const char *zFormat, ...){
  assert( db!=0 );
  db->errCode = err_code;
  sqlite3SystemError(db, err_code);
  if( zFormat==0 ){
    sqlite3Error(db, err_code);
  }else if( db->pErr || (db->pErr = sqlite3ValueNew(db))!=0 ){
    char *z;
    va_list ap;
    va_start(ap, zFormat);
    z = sqlite3VMPrintf(db, zFormat, ap);
    va_end(ap);
    sqlite3ValueSetStr(db->pErr, -1, z, SQLITE_UTF8, SQLITE_DYNAMIC);
  }
}